

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

prsndef * prsxarg(prscxdef *ctx)

{
  int iVar1;
  prsndef *ppVar2;
  prsndef *n2;
  prsbdef *binctx;
  
  binctx = &prsb_asi_C;
  if ((ctx->prscxtok->tokcxflg & 4) == 0) {
    binctx = &prsb_asi;
  }
  ppVar2 = prsxbin(ctx,binctx);
  iVar1 = (ctx->prscxtok->tokcxcur).toktyp;
  toknext(ctx->prscxtok);
  if (iVar1 != 0x3f) {
    if (iVar1 == 0x33) {
      return ppVar2;
    }
    errsigf(ctx->prscxerr,"TADS",0x130);
  }
  n2 = prsxarg(ctx);
  ppVar2 = prsnew2(ctx,0x33,ppVar2,n2);
  return ppVar2;
}

Assistant:

static prsndef *prsxarg(prscxdef *ctx)
{
    prsndef *n;
    int      t;
    
    /* arguments are assignments:  just under comma-expressions */
    n = prsxbin(ctx, prs_cmode(ctx) ? &prsb_asi_C : &prsb_asi);
    
    t = ctx->prscxtok->tokcxcur.toktyp;
    toknext(ctx->prscxtok);
    switch(t)
    {
    case TOKTRPAR:
        return(n);
        
    case TOKTCOMMA:
        return(prsnew2(ctx, TOKTRPAR, n, prsxarg(ctx)));
        
    default:
        errsig(ctx->prscxerr, ERR_REQARG);
        NOTREACHEDV(prsndef *);
        return 0;
    }
}